

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsIdle(uint *nextIdleTick)

{
  ScriptContext *pSVar1;
  JsrtRuntime *this;
  bool bVar2;
  uint uVar3;
  JsrtContext *pJVar4;
  ThreadContext *pTVar5;
  JsErrorCode JVar6;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (nextIdleTick == (uint *)0x0) {
    return JsErrorNullArgument;
  }
  pJVar4 = JsrtContext::GetCurrent();
  if (pJVar4 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  pSVar1 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  *nextIdleTick = 0;
  pTVar5 = pSVar1->threadContext;
  if (pTVar5->recycler != (Recycler *)0x0) {
    bVar2 = Memory::Recycler::IsHeapEnumInProgress(pTVar5->recycler);
    JVar6 = JsErrorHeapEnumInProgress;
    if (bVar2) goto LAB_00380609;
    pTVar5 = pSVar1->threadContext;
  }
  JVar6 = JsErrorInThreadServiceCallback;
  if ((pTVar5->threadService).isInCallback == false) {
    pJVar4 = JsrtContext::GetCurrent();
    this = (pJVar4->runtime).ptr;
    JVar6 = JsErrorIdleNotEnabled;
    if (this->useIdle == true) {
      uVar3 = JsrtRuntime::Idle(this);
      *nextIdleTick = uVar3;
      JVar6 = JsNoError;
    }
  }
LAB_00380609:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar6;
}

Assistant:

CHAKRA_API JsIdle(_Out_opt_ unsigned int *nextIdleTick)
{
    PARAM_NOT_NULL(nextIdleTick);

    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext * scriptContext) -> JsErrorCode {

            *nextIdleTick = 0;

            if (scriptContext->GetThreadContext()->GetRecycler() && scriptContext->GetThreadContext()->GetRecycler()->IsHeapEnumInProgress())
            {
                return JsErrorHeapEnumInProgress;
            }
            else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
            {
                return JsErrorInThreadServiceCallback;
            }

            JsrtContext * context = JsrtContext::GetCurrent();
            JsrtRuntime * runtime = context->GetRuntime();

            if (!runtime->UseIdle())
            {
                return JsErrorIdleNotEnabled;
            }

            unsigned int ticks = runtime->Idle();

            *nextIdleTick = ticks;

            return JsNoError;
    });
}